

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# file_utils.c
# Opt level: O0

int read_record(FILE *fp,int fields_number,char ***record_values)

{
  char cVar1;
  bool bVar2;
  int iVar3;
  char **ppcVar4;
  char *pcVar5;
  size_t sVar6;
  int local_4e60;
  int record_len;
  int chr_pos;
  char chr;
  uint i;
  int in_quotes;
  int r_field_len;
  int r_field_index;
  char r_field [10000];
  char record [10000];
  char ***record_values_local;
  int fields_number_local;
  FILE *fp_local;
  
  in_quotes = 0;
  i = 0;
  bVar2 = false;
  if (fields_number < 0) {
    *record_values = (char **)0x0;
    fp_local._4_4_ = -1;
  }
  else if (fp == (FILE *)0x0) {
    *record_values = (char **)0x0;
    fp_local._4_4_ = -1;
  }
  else {
    memset(&r_field_len,0,10000);
    ppcVar4 = (char **)malloc((long)fields_number << 3);
    *record_values = ppcVar4;
    if (*record_values == (char **)0x0) {
      fp_local._4_4_ = -1;
    }
    else {
      for (chr_pos = 0; (uint)chr_pos < (uint)fields_number; chr_pos = chr_pos + 1) {
        pcVar5 = strdup("");
        (*record_values)[(uint)chr_pos] = pcVar5;
      }
      pcVar5 = fgets(r_field + 0x2708,10000,(FILE *)fp);
      if (pcVar5 == (char *)0x0) {
        free_cstr_arr(*record_values,(long)fields_number);
        *record_values = (char **)0x0;
        fp_local._4_4_ = -1;
      }
      else {
        local_4e60 = 0;
        sVar6 = strlen(r_field + 0x2708);
        strcat(r_field + 0x2708,"\n");
        while( true ) {
          iVar3 = local_4e60 + 1;
          cVar1 = r_field[(long)local_4e60 + 0x2708];
          if (cVar1 == '\0') break;
          if (cVar1 == '\"') {
            if (bVar2) {
              if ((iVar3 < (int)sVar6) && (r_field[(long)iVar3 + 0x2708] == '\"')) {
                *(undefined1 *)((long)&r_field_len + (long)(int)i) = 0x22;
                local_4e60 = local_4e60 + 2;
                i = i + 1;
              }
              else {
                bVar2 = false;
                local_4e60 = iVar3;
              }
            }
            else {
              bVar2 = true;
              local_4e60 = iVar3;
            }
          }
          else if ((((cVar1 != ',') && (cVar1 != '\n')) || (bVar2)) || (fields_number <= in_quotes))
          {
            local_4e60 = iVar3;
            if ((cVar1 != '\n') && (cVar1 != '\r')) {
              *(char *)((long)&r_field_len + (long)(int)i) = cVar1;
              i = i + 1;
            }
          }
          else {
            free((*record_values)[in_quotes]);
            pcVar5 = strdup((char *)&r_field_len);
            (*record_values)[in_quotes] = pcVar5;
            if ((*record_values)[in_quotes] == (char *)0x0) {
              free_cstr_arr(*record_values,(long)in_quotes);
              *record_values = (char **)0x0;
              return -1;
            }
            memset(&r_field_len,0,10000);
            i = 0;
            in_quotes = in_quotes + 1;
            local_4e60 = iVar3;
          }
        }
        fp_local._4_4_ = 1;
      }
    }
  }
  return fp_local._4_4_;
}

Assistant:

int read_record(FILE *fp, const int fields_number, char ***record_values) {
    char record[LINE_MAX_LEN];
    char r_field[LINE_MAX_LEN];
    int r_field_index = 0;
    int r_field_len = 0;
    int in_quotes = 0;  // to ignore commas in "dbl_quoted" field values

    if (fields_number < 0) {
        *record_values = NULL;
        return -1;
    }

    if (fp == NULL) {
        *record_values = NULL;
        return -1;
    }

    memset(r_field, 0, LINE_MAX_LEN);

    *record_values = malloc(fields_number * sizeof(char *));
    if (*record_values == NULL) {
        return -1;
    }
    for (unsigned i = 0; i < fields_number; i++)
        (*record_values)[i] = strdup("");

    if (!fgets(record, LINE_MAX_LEN, fp)) {
        free_cstr_arr(*record_values, fields_number);
        *record_values = NULL;
        return -1;
    }

    char chr;
    int chr_pos = 0;
    int record_len = strlen(record);  // In theory, is guaranteed to have null-terminator, as
                                      // fgets() automatically applies one.
                                      // If not, pls PR or drop maintainer(s) a line.

    strcat(record, "\n");  // fixes the error that happens when the last record isn't followed by a newline
                           // (then the last record field fails to be parsed)

    while ((chr = record[++chr_pos - 1])) {
        if (chr == '"') {
            if (in_quotes == 0) {
                in_quotes = 1;
            } else {
                if (chr_pos < record_len && record[chr_pos] == '"') {
                    r_field[++r_field_len - 1] = '"';
                    chr_pos++;
                } else {
                    in_quotes = 0;
                }
            }
        } else if ((chr == ',' || chr == '\n') && !in_quotes && r_field_index < fields_number) {
            free((*record_values)[r_field_index]);
            (*record_values)[r_field_index] = strdup(r_field);

            if ((*record_values)[r_field_index] == NULL) {
                free_cstr_arr(*record_values, r_field_index);
                *record_values = NULL;
                return -1;
            }

            memset(r_field, 0, LINE_MAX_LEN);
            r_field_len = 0;
            r_field_index++;
        } else if (chr != '\n' && chr != '\r') {
            r_field[++r_field_len - 1] = chr;
        }
    }
    return 1;
}